

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

void Internal_GrowNgon(ON_MeshTopology *top,uchar *emarks,uchar *fmarks,uchar etest_mask,
                      uchar etest_result,uchar ftest_mask,uchar ftest_result,uchar merged_mark,
                      ON_SimpleArray<unsigned_int> *ngon_fi)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ON_MeshTopologyFace *pOVar5;
  ON_MeshTopologyEdge *pOVar6;
  int *piVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  ON_SimpleArray<unsigned_int> *this;
  long lVar11;
  undefined7 in_stack_00000011;
  uint local_4c;
  uchar *local_48;
  long local_40;
  long local_38;
  
  this = (ON_SimpleArray<unsigned_int> *)CONCAT71(in_stack_00000011,merged_mark);
  iVar8 = this->m_count;
  if (0 < iVar8) {
    iVar1 = (top->m_topf).m_count;
    for (lVar10 = 0; lVar10 < iVar8; lVar10 = lVar10 + 1) {
      fmarks[this->m_a[lVar10]] = fmarks[this->m_a[lVar10]] | 0x80;
      iVar8 = this->m_count;
    }
    local_48 = fmarks;
    for (local_38 = 0; local_38 < iVar8; local_38 = local_38 + 1) {
      lVar11 = (long)(int)this->m_a[local_38];
      pOVar5 = (top->m_topf).m_a;
      iVar2 = pOVar5[lVar11].m_topei[2];
      iVar8 = pOVar5[lVar11].m_topei[3];
      iVar3 = pOVar5[lVar11].m_topei[1];
      iVar4 = pOVar5[lVar11].m_topei[0];
      local_40 = lVar11;
      for (lVar10 = 0; 4 - (ulong)(iVar4 != iVar3 && iVar2 == iVar8) != lVar10; lVar10 = lVar10 + 1)
      {
        lVar9 = (long)pOVar5[lVar11].m_topei[lVar10];
        if (((-1 < lVar9) && (pOVar5[lVar11].m_topei[lVar10] <= (top->m_tope).m_count)) &&
           ((emarks[lVar9] & (etest_mask | 0x80)) == etest_result)) {
          emarks[lVar9] = emarks[lVar9] | 0x80;
          pOVar6 = (top->m_tope).m_a;
          if ((pOVar6[lVar9].m_topf_count == 2) &&
             (piVar7 = pOVar6[lVar9].m_topfi, piVar7 != (int *)0x0)) {
            local_4c = piVar7[(int)local_40 == *piVar7];
            lVar9 = (long)(int)local_4c;
            if ((-1 < lVar9) &&
               (((int)local_4c < iVar1 && ((fmarks[lVar9] & (ftest_mask | 0x80)) == ftest_result))))
            {
              fmarks[lVar9] = fmarks[lVar9] | 0x80;
              ON_SimpleArray<unsigned_int>::Append(this,&local_4c);
              this = (ON_SimpleArray<unsigned_int> *)CONCAT71(in_stack_00000011,merged_mark);
              fmarks = local_48;
            }
          }
        }
      }
      iVar8 = this->m_count;
    }
  }
  return;
}

Assistant:

static void Internal_GrowNgon(
  const ON_MeshTopology& top,
  unsigned char* emarks,
  unsigned char* fmarks,
  unsigned char etest_mask,
  unsigned char etest_result,
  unsigned char ftest_mask,
  unsigned char ftest_result,
  const unsigned char merged_mark,
  ON_SimpleArray<unsigned>& ngon_fi
)
{
  if (ngon_fi.Count() <= 0)
    return;

  const int face_count = top.m_topf.Count();

  for (int nfi = 0; nfi < ngon_fi.Count(); ++nfi)
    fmarks[ngon_fi[nfi]] |= merged_mark;

  etest_mask |= merged_mark;
  etest_result &= ~merged_mark;

  ftest_mask |= merged_mark;
  ftest_result &= ~merged_mark;

  for (int nfi = 0; nfi < ngon_fi.Count(); ++nfi)
  {
    const int f0i = ngon_fi[nfi];
    const ON_MeshTopologyFace& f0 = top.m_topf[f0i];
    const int f0_ecount = f0.IsTriangle() ? 3 : 4;
    for (int fei = 0; fei < f0_ecount; ++fei)
    {
      const int ei = f0.m_topei[fei];
      if (ei < 0 || ei > top.m_tope.Count())
        continue;
      if (etest_result != (emarks[ei] & etest_mask))
        continue;
      emarks[ei] |= merged_mark;
      const ON_MeshTopologyEdge& e = top.m_tope[ei];
      if (2 != e.m_topf_count || nullptr == e.m_topfi)
        continue;
      const int efi = (f0i != e.m_topfi[0]) ? 0 : 1;
      const int f1i = e.m_topfi[efi];
      if (f1i < 0 || f1i >= face_count)
        continue;
      if (ftest_result != (fmarks[f1i] & ftest_mask))
        continue;
      fmarks[f1i] |= merged_mark;
      ngon_fi.Append(f1i);
    }
  }
}